

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,signed_char,duckdb::QuantileListOperation<double,false>>
               (char *idata,AggregateInputData *aggr_input_data,
               QuantileState<signed_char,_duckdb::QuantileStandardType> *state,idx_t count,
               ValidityMask *mask)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  AggregateUnaryInput local_48;
  
  local_48.input_idx = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar6 = 0;
  local_48.input = aggr_input_data;
  local_48.input_mask = mask;
  do {
    if (uVar6 == count + 0x3f >> 6) {
      return;
    }
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      uVar9 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar9 = count;
      }
LAB_01d081b0:
      while (uVar3 = uVar8, uVar4 = uVar7, iVar5 = local_48.input_idx, uVar8 < uVar9) {
        QuantileOperation::
        Operation<signed_char,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,false>>
                  (state,idata + uVar8,&local_48);
        uVar8 = local_48.input_idx + 1;
        uVar7 = uVar8;
        local_48.input_idx = uVar8;
      }
    }
    else {
      uVar2 = puVar1[uVar6];
      uVar9 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar9 = count;
      }
      if (uVar2 == 0xffffffffffffffff) goto LAB_01d081b0;
      uVar3 = uVar9;
      uVar4 = uVar9;
      iVar5 = uVar9;
      if (uVar2 != 0) {
        while (uVar3 = uVar7, uVar4 = uVar7, iVar5 = local_48.input_idx, uVar7 < uVar9) {
          if ((uVar2 >> ((ulong)(uint)((int)uVar7 - (int)uVar8) & 0x3f) & 1) != 0) {
            QuantileOperation::
            Operation<signed_char,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,false>>
                      (state,idata + uVar7,&local_48);
            uVar7 = local_48.input_idx;
          }
          uVar7 = uVar7 + 1;
          local_48.input_idx = uVar7;
        }
      }
    }
    local_48.input_idx = iVar5;
    uVar7 = uVar4;
    uVar8 = uVar3;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static inline void UnaryFlatUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                       STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask) {
		AggregateUnaryInput input(aggr_input_data, mask);
		auto &base_idx = input.input_idx;
		base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (!OP::IgnoreNull() || ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
					}
				}
			}
		}
	}